

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

size_t MemPoolBlkSize(size_t leaf_count)

{
  size_t sVar1;
  undefined8 local_48;
  undefined8 local_40;
  size_t nodes_per_blk;
  size_t sz;
  size_t sizeof_node;
  size_t node_count;
  size_t pagesize;
  size_t sizeof_blklink;
  size_t leaf_count_local;
  
  sVar1 = SizeofBlkLink();
  node_count = ON_MemoryPageSize();
  if (node_count <= sVar1) {
    node_count = 0x1000;
  }
  sizeof_node = 0x20;
  if (leaf_count != 0) {
    if (leaf_count * 5 < 0x18) {
      sizeof_node = 3;
    }
    else if (leaf_count * 5 < 0x90) {
      sizeof_node = 7;
    }
  }
  nodes_per_blk = node_count;
  if (sizeof_node < 0x20) {
    local_48 = sizeof_node;
  }
  else {
    local_48 = (node_count - sVar1) / 0x158;
  }
  local_40 = local_48;
  while (local_40 < sizeof_node) {
    nodes_per_blk = node_count + nodes_per_blk;
    local_40 = (nodes_per_blk - sVar1) / 0x158;
  }
  if (nodes_per_blk < sVar1 + local_40 * 0x158 + 0x10) {
    local_40 = local_40 - 1;
  }
  return sVar1 + local_40 * 0x158;
}

Assistant:

static size_t MemPoolBlkSize( size_t leaf_count )
{
  // sizeof_blklink = number of bytes to reserve for the
  // struct ON_RTreeMemPool::Blk header used to keep track
  // of our allocations.
  const size_t sizeof_blklink = SizeofBlkLink();

  // pagesize = OS memory manager page size.  We want the
  // allocated blocks to be some smallish multiples of pagesize
  // to the active sections of the tree will end up in CPU cache 
  // when the tree is being repeatedly searched.
  size_t pagesize = ON_MemoryPageSize();
  if ( pagesize <= sizeof_blklink )
    pagesize = 4096;

  size_t node_count = 32;
  if ( leaf_count > 0 )
  {
    // When the user can estimate the number of leaves,
    // node_count is an estimate of the number of nodes needed
    // to build the tree.  When node_count is small, we avoid
    // allocating too much memory for a tiny tree.  The goal
    // is to avoid wasting lots of memory when there are thousands
    // of individual trees, most with a less than six leaves.
    // If there are only a few trees, or most of the trees have
    // lots of leaves, then hard coding node_count = 32 works
    // just fine.
    if ( 5*leaf_count < 4*ON_RTree_MAX_NODE_COUNT )
      node_count = 3;
    else if ( 5*leaf_count < 4*ON_RTree_MAX_NODE_COUNT*ON_RTree_MAX_NODE_COUNT )
      node_count = ON_RTree_MAX_NODE_COUNT+1;
  }
  
  // Set "sz" to an multiple of pagesize that is big enough
  // to hold node_count nodes.
  const size_t sizeof_node = sizeof(ON_RTreeNode);
  size_t sz = pagesize;
  size_t nodes_per_blk = ( node_count < 32 )
                       ? node_count
                       : (sz-sizeof_blklink)/sizeof_node;
  while ( nodes_per_blk < node_count )
  {
    sz += pagesize;
    nodes_per_blk = (sz-sizeof_blklink)/sizeof_node;
  }

  // Some lame allocators pad each allocation request and use the extra space
  // to store allocation bookkeeping information.  The "+ 2*sizeof(void*) allows 
  // for up to two pointers of "lame" system overhead per allocation.  The goal
  // is to prevent the "real" allocation from being just a hair bigger that a 
  // multiple of pagesize.
  if ( sz < sizeof_blklink + nodes_per_blk*sizeof_node + 2*sizeof(void*)  ) 
    nodes_per_blk--; // prevent memory manager overhead from allocating another page

  // Return the minimum number of bytes we need for each block. An decent
  // OS should assign this allocation an efficient set of pages.
  return (sizeof_blklink + nodes_per_blk*sizeof_node);
}